

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5UnicodeCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  byte *pbVar1;
  byte bVar2;
  uchar uVar3;
  int iTbl;
  int iVar4;
  uint uVar5;
  Unicode61Tokenizer *p;
  char *pcVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  char *pcVar11;
  
  if ((nArg & 1U) != 0) {
    return 1;
  }
  p = (Unicode61Tokenizer *)sqlite3_malloc(0xc0);
  if (p != (Unicode61Tokenizer *)0x0) {
    memset(p,0,0xc0);
    p->nFold = 0x40;
    p->eRemoveDiacritic = 1;
    pcVar6 = (char *)sqlite3_malloc64(0x40);
    p->aFold = pcVar6;
    pcVar11 = "L* N* Co";
    for (lVar7 = 0; (pcVar6 != (char *)0x0 && (lVar7 < nArg)); lVar7 = lVar7 + 2) {
      iVar4 = sqlite3_stricmp(azArg[lVar7],"categories");
      if (iVar4 == 0) {
        pcVar11 = azArg[lVar7 + 1];
      }
    }
    if (pcVar6 != (char *)0x0) {
      uVar10 = (ulong)(byte)*pcVar11;
      uVar5 = 1;
LAB_001d4dc9:
      if ((char)uVar10 == '\0') goto LAB_001d5167;
      while (((char)uVar10 == '\t' || ((int)uVar10 == 0x20))) {
        pbVar1 = (byte *)pcVar11 + 1;
        pcVar11 = (char *)((byte *)pcVar11 + 1);
        uVar10 = (ulong)*pbVar1;
      }
      if ((int)uVar10 != 0) {
        p->aCategory[0] = '\x01';
        switch(*pcVar11) {
        case 'L':
          bVar2 = ((byte *)pcVar11)[1];
          switch(bVar2) {
          case 0x6c:
            p->aCategory[5] = '\x01';
            break;
          case 0x6d:
            p->aCategory[6] = '\x01';
            break;
          case 0x6e:
          case 0x70:
          case 0x71:
          case 0x72:
          case 0x73:
            goto switchD_001d4e11_caseD_4f;
          case 0x6f:
            p->aCategory[7] = '\x01';
            break;
          case 0x74:
            p->aCategory[8] = '\x01';
            break;
          case 0x75:
            p->aCategory[9] = '\x01';
            break;
          default:
            if (bVar2 == 0x2a) {
              p->aCategory[0x1e] = '\x01';
              builtin_memcpy(p->aCategory + 5,"\x01\x01\x01\x01\x01",5);
            }
            else {
              if (bVar2 != 0x43) goto switchD_001d4e11_caseD_4f;
              p->aCategory[0x1e] = '\x01';
            }
          }
          break;
        case 'M':
          bVar2 = ((byte *)pcVar11)[1];
          if (bVar2 == 0x2a) {
            p->aCategory[10] = '\x01';
            p->aCategory[0xb] = '\x01';
          }
          else if (bVar2 != 0x6e) {
            if (bVar2 != 0x65) {
              if (bVar2 == 99) {
                p->aCategory[10] = '\x01';
                break;
              }
              goto switchD_001d4e11_caseD_4f;
            }
            p->aCategory[0xb] = '\x01';
            break;
          }
          p->aCategory[0xc] = '\x01';
          break;
        case 'N':
          bVar2 = ((byte *)pcVar11)[1];
          if (bVar2 == 0x2a) {
            p->aCategory[0xd] = '\x01';
            p->aCategory[0xe] = '\x01';
          }
          else if (bVar2 != 0x6f) {
            if (bVar2 != 0x6c) {
              if (bVar2 == 100) {
                p->aCategory[0xd] = '\x01';
                break;
              }
              goto switchD_001d4e11_caseD_4f;
            }
            p->aCategory[0xe] = '\x01';
            break;
          }
          p->aCategory[0xf] = '\x01';
          break;
        case 'O':
        case 'Q':
        case 'R':
        case 'T':
        case 'U':
        case 'V':
        case 'W':
        case 'X':
        case 'Y':
          goto switchD_001d4e11_caseD_4f;
        case 'P':
          switch(((byte *)pcVar11)[1]) {
          case 99:
            p->aCategory[0x10] = '\x01';
            break;
          case 100:
            p->aCategory[0x11] = '\x01';
            break;
          case 0x65:
            p->aCategory[0x12] = '\x01';
            break;
          case 0x66:
            p->aCategory[0x13] = '\x01';
            break;
          case 0x67:
          case 0x68:
          case 0x6a:
          case 0x6b:
          case 0x6c:
          case 0x6d:
          case 0x6e:
          case 0x70:
          case 0x71:
          case 0x72:
            goto switchD_001d4e11_caseD_4f;
          case 0x69:
            p->aCategory[0x14] = '\x01';
            break;
          case 0x6f:
            p->aCategory[0x15] = '\x01';
            break;
          case 0x73:
            p->aCategory[0x16] = '\x01';
            break;
          default:
            if (((byte *)pcVar11)[1] != 0x2a) goto switchD_001d4e11_caseD_4f;
            builtin_memcpy(p->aCategory + 0x10,"\x01\x01\x01\x01\x01\x01\x01",7);
          }
          break;
        case 'S':
          bVar2 = ((byte *)pcVar11)[1];
          if (bVar2 == 0x2a) {
            builtin_memcpy(p->aCategory + 0x17,"\x01\x01\x01\x01",4);
          }
          else if (bVar2 == 0x6f) {
            p->aCategory[0x1a] = '\x01';
          }
          else if (bVar2 == 0x6b) {
            p->aCategory[0x18] = '\x01';
          }
          else if (bVar2 == 0x6d) {
            p->aCategory[0x19] = '\x01';
          }
          else {
            if (bVar2 != 99) goto switchD_001d4e11_caseD_4f;
            p->aCategory[0x17] = '\x01';
          }
          break;
        case 'Z':
          bVar2 = ((byte *)pcVar11)[1];
          if (bVar2 == 0x2a) {
            p->aCategory[0x1b] = '\x01';
            p->aCategory[0x1c] = '\x01';
          }
          else if (bVar2 != 0x73) {
            if (bVar2 != 0x70) {
              if (bVar2 == 0x6c) {
                p->aCategory[0x1b] = '\x01';
                break;
              }
              goto switchD_001d4e11_caseD_4f;
            }
            p->aCategory[0x1c] = '\x01';
            break;
          }
          p->aCategory[0x1d] = '\x01';
          break;
        default:
          if (*pcVar11 != 0x43) goto switchD_001d4e11_caseD_4f;
          bVar2 = ((byte *)pcVar11)[1];
          if (bVar2 == 0x2a) {
            p->aCategory[0x1f] = '\x01';
            builtin_memcpy(p->aCategory + 1,"\x01\x01\x01\x01",4);
          }
          else if (bVar2 == 0x73) {
            p->aCategory[4] = '\x01';
          }
          else if (bVar2 == 0x66) {
            p->aCategory[2] = '\x01';
          }
          else if (bVar2 == 0x6e) {
            p->aCategory[3] = '\x01';
          }
          else if (bVar2 == 0x6f) {
            p->aCategory[0x1f] = '\x01';
          }
          else {
            if (bVar2 != 99) goto switchD_001d4e11_caseD_4f;
            p->aCategory[1] = '\x01';
          }
        }
      }
      while ((uVar10 = (ulong)(byte)*pcVar11, 0x20 < uVar10 ||
             ((0x100000201U >> (uVar10 & 0x3f) & 1) == 0))) {
        pcVar11 = (char *)((byte *)pcVar11 + 1);
      }
      goto LAB_001d4dc9;
    }
    uVar5 = 7;
    goto switchD_001d4e11_caseD_4f;
  }
  uVar5 = 7;
LAB_001d5283:
  fts5UnicodeDelete((Fts5Tokenizer *)p);
  p = (Unicode61Tokenizer *)0x0;
LAB_001d5292:
  *ppOut = (Fts5Tokenizer *)p;
  return uVar5;
LAB_001d5167:
  lVar7 = 0;
  lVar8 = 0;
  while (iVar4 = (int)lVar8, iVar4 < 0x80) {
    uVar3 = p->aCategory[aFts5UnicodeData[lVar7] & 0x1f];
    iVar9 = (uint)(aFts5UnicodeData[lVar7] >> 5) + iVar4;
    if (0x7f < iVar9) {
      iVar9 = 0x80;
    }
    for (lVar8 = (long)iVar4; lVar8 < iVar9; lVar8 = lVar8 + 1) {
      p->aTokenChar[lVar8] = uVar3;
    }
    lVar7 = lVar7 + 1;
  }
  p->aTokenChar[0] = '\0';
  uVar5 = 0;
switchD_001d4e11_caseD_4f:
  for (lVar7 = 0; (uVar5 == 0 && (lVar7 < nArg)); lVar7 = lVar7 + 2) {
    pcVar11 = azArg[lVar7];
    pbVar1 = (byte *)azArg[lVar7 + 1];
    iVar4 = sqlite3_stricmp(pcVar11,"remove_diacritics");
    if (iVar4 == 0) {
      uVar5 = 1;
      if (((byte)(*pbVar1 - 0x30) < 3) && (pbVar1[1] == 0)) {
        p->eRemoveDiacritic = *pbVar1 - 0x30;
        uVar5 = 0;
      }
    }
    else {
      iVar4 = sqlite3_stricmp(pcVar11,"tokenchars");
      if (iVar4 == 0) {
        iVar4 = 1;
      }
      else {
        iVar4 = sqlite3_stricmp(pcVar11,"separators");
        if (iVar4 != 0) {
          iVar4 = sqlite3_stricmp(pcVar11,"categories");
          uVar5 = (uint)(iVar4 != 0);
          goto LAB_001d5271;
        }
        iVar4 = 0;
      }
      uVar5 = fts5UnicodeAddExceptions(p,(char *)pbVar1,iVar4);
    }
LAB_001d5271:
  }
  if (uVar5 == 0) {
    uVar5 = 0;
    goto LAB_001d5292;
  }
  goto LAB_001d5283;
}

Assistant:

static int fts5UnicodeCreate(
  void *pUnused,
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;             /* Return code */
  Unicode61Tokenizer *p = 0;      /* New tokenizer object */

  UNUSED_PARAM(pUnused);

  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = (Unicode61Tokenizer*)sqlite3_malloc(sizeof(Unicode61Tokenizer));
    if( p ){
      const char *zCat = "L* N* Co";
      int i;
      memset(p, 0, sizeof(Unicode61Tokenizer));

      p->eRemoveDiacritic = FTS5_REMOVE_DIACRITICS_SIMPLE;
      p->nFold = 64;
      p->aFold = sqlite3_malloc64(p->nFold * sizeof(char));
      if( p->aFold==0 ){
        rc = SQLITE_NOMEM;
      }

      /* Search for a "categories" argument */
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          zCat = azArg[i+1];
        }
      }
      if( rc==SQLITE_OK ){
        rc = unicodeSetCategories(p, zCat);
      }

      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "remove_diacritics") ){
          if( (zArg[0]!='0' && zArg[0]!='1' && zArg[0]!='2') || zArg[1] ){
            rc = SQLITE_ERROR;
          }else{
            p->eRemoveDiacritic = (zArg[0] - '0');
            assert( p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_NONE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_SIMPLE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_COMPLEX
            );
          }
        }else
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 0);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          /* no-op */
        }else{
          rc = SQLITE_ERROR;
        }
      }
    }else{
      rc = SQLITE_NOMEM;
    }
    if( rc!=SQLITE_OK ){
      fts5UnicodeDelete((Fts5Tokenizer*)p);
      p = 0;
    }
    *ppOut = (Fts5Tokenizer*)p;
  }
  return rc;
}